

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

bool QDockWidgetLayout::wmSupportsNativeWindowDeco(void)

{
  undefined1 uVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (wmSupportsNativeWindowDeco()::xcb == '\0') {
    iVar2 = __cxa_guard_acquire(&wmSupportsNativeWindowDeco()::xcb);
    if (iVar2 != 0) {
      QGuiApplication::platformName();
      iVar2 = QString::compare((QLatin1String *)&local_30,3);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
      wmSupportsNativeWindowDeco::xcb = iVar2 == 0;
      __cxa_guard_release(&wmSupportsNativeWindowDeco()::xcb);
    }
  }
  if (wmSupportsNativeWindowDeco()::wayland == '\0') {
    iVar2 = __cxa_guard_acquire(&wmSupportsNativeWindowDeco()::wayland);
    if (iVar2 != 0) {
      QGuiApplication::platformName();
      uVar1 = QString::startsWith((QLatin1String *)&local_30,7);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
      wmSupportsNativeWindowDeco::wayland = (bool)uVar1;
      __cxa_guard_release(&wmSupportsNativeWindowDeco()::wayland);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)(((wmSupportsNativeWindowDeco::wayland | wmSupportsNativeWindowDeco::xcb) ^ 1U) & 1
                 );
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetLayout::wmSupportsNativeWindowDeco()
{
#if defined(Q_OS_ANDROID)
    return false;
#else
    static const bool xcb = !QGuiApplication::platformName().compare("xcb"_L1, Qt::CaseInsensitive);
    static const bool wayland =
            QGuiApplication::platformName().startsWith("wayland"_L1, Qt::CaseInsensitive);
    return !(xcb || wayland);
#endif
}